

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O3

plain_range_sorted<int>
partition_binary<plain_range_sorted<int>,int>(plain_range_sorted<int> range,int value)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  plain_range_sorted<int> pVar7;
  
  piVar3 = range.super_plain_range<int>.end;
  piVar4 = range.super_plain_range<int>.begin;
  if (piVar4 < piVar3) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x97,1,"empty");
    if (piVar3[-1] < value) {
      piVar4 = (int *)0x0;
      piVar3 = (int *)0x0;
    }
    else {
      uVar2 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
      uVar6 = (uint)uVar2;
      while (1 < uVar6) {
        uVar6 = (uint)uVar2 - 1;
        uVar5 = uVar6 >> 1;
        dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                       ,0x98,(uint)(uVar5 < (uint)uVar2),"out of range");
        piVar3 = piVar4 + uVar5;
        iVar1 = *piVar3;
        if (iVar1 < value) {
          piVar4 = piVar4 + (ulong)uVar5 + 1;
        }
        if (value <= iVar1) {
          uVar6 = 0;
        }
        piVar3 = piVar3 + (ulong)uVar6 + 1;
        uVar2 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
        uVar6 = (uint)uVar2;
      }
    }
  }
  pVar7.super_plain_range<int>.end = piVar3;
  pVar7.super_plain_range<int>.begin = piVar4;
  return (plain_range_sorted<int>)pVar7.super_plain_range<int>;
}

Assistant:

R partition_binary(R range, T value)
{
	concept_empty::check(range);
	concept_index::check(range);
	concept_size::check(range);
	concept_slice::check(range);
	concept_sorted::check(range);

	if(range.empty())
		return range;
	if(range.back() < value)
		return R();

	while(range.size() > 1)
	{
		unsigned pivot = (range.size()-1)/2;
		if(range.index(pivot) < value)
			range = range.slice(pivot+1, range.size()-1);
		else
			range = range.slice(0, pivot+1);
	}
	return range;
}